

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_typeSlot_getValidReferenceType(sysbvm_context_t *context,sysbvm_tuple_t typeSlot)

{
  sysbvm_tuple_t sVar1;
  
  if (typeSlot != 0 && (typeSlot & 0xf) == 0) {
    if (*(long *)(typeSlot + 0x38) == 0) {
      sVar1 = sysbvm_type_createMemberReferenceType(context,*(sysbvm_tuple_t *)(typeSlot + 0x30));
      *(sysbvm_tuple_t *)(typeSlot + 0x38) = sVar1;
    }
    return *(sysbvm_tuple_t *)(typeSlot + 0x38);
  }
  sVar1 = sysbvm_type_createMemberReferenceType(context,(context->roots).anyValueType);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_typeSlot_getValidReferenceType(sysbvm_context_t *context, sysbvm_tuple_t typeSlot)
{
    if(!sysbvm_tuple_isNonNullPointer(typeSlot))
        return sysbvm_type_createMemberReferenceType(context, context->roots.anyValueType);

    sysbvm_typeSlot_t *typeSlotObject = (sysbvm_typeSlot_t*)typeSlot;
    if(!typeSlotObject->referenceType)
        typeSlotObject->referenceType = sysbvm_type_createMemberReferenceType(context, typeSlotObject->type);

    return typeSlotObject->referenceType;
}